

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

iterator __thiscall
tf::SmallVectorImpl<tf::Node*>::insert<tf::Node**>
          (SmallVectorImpl<tf::Node_*> *this,iterator I,Node **From,Node **To)

{
  iterator ppNVar1;
  iterator ppNVar2;
  long lVar3;
  undefined8 *in_RDX;
  Node **in_RSI;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RDI;
  Node **J;
  size_t NumOverwritten;
  Node **OldEnd;
  Node **OldEnd_1;
  size_t NumToInsert;
  size_t InsertElt;
  Node **in_stack_ffffffffffffff68;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffff70;
  Node **I_00;
  Node **in_stack_ffffffffffffff78;
  Node **in_stack_ffffffffffffff98;
  Node **ppNVar4;
  SmallVectorImpl<tf::Node_*> *in_stack_ffffffffffffffa0;
  move_iterator<tf::Node_**> in_stack_ffffffffffffffa8;
  move_iterator<tf::Node_**> in_stack_ffffffffffffffb0;
  move_iterator<tf::Node_**> local_48;
  iterator local_40;
  ulong local_38;
  long local_30;
  undefined8 *local_20;
  Node **local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
  local_30 = (long)in_RSI - (long)ppNVar1 >> 3;
  ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  if (local_18 == ppNVar1) {
    append<tf::Node**>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,local_18);
    local_8 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
    local_8 = local_8 + local_30;
  }
  else {
    local_38 = std::distance<tf::Node**>((Node **)in_RDI,in_stack_ffffffffffffff78);
    SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff70);
    SmallVectorImpl<tf::Node_*>::reserve
              ((SmallVectorImpl<tf::Node_*> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
    local_18 = ppNVar1 + local_30;
    ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
    if ((ulong)((long)ppNVar1 - (long)local_18 >> 3) < local_38) {
      ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RDI,ppNVar2 + local_38);
      lVar3 = (long)ppNVar1 - (long)local_18 >> 3;
      I_00 = local_18;
      SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      SmallVectorTemplateBase<tf::Node*,true>::uninitialized_move<tf::Node**,tf::Node**>
                (I_00,in_stack_ffffffffffffff68,(Node **)0x11ffcd);
      ppNVar4 = local_18;
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppNVar4 = (Node *)*local_20;
        ppNVar4 = ppNVar4 + 1;
        local_20 = local_20 + 1;
      }
      SmallVectorTemplateBase<tf::Node*,true>::uninitialized_copy<tf::Node*,tf::Node*>
                ((Node **)in_RDI,ppNVar1,I_00,in_stack_ffffffffffffff68);
      local_8 = local_18;
    }
    else {
      local_40 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      std::move_iterator<tf::Node_**>::move_iterator(&local_48,ppNVar1 + -local_38);
      ppNVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
      std::move_iterator<tf::Node_**>::move_iterator
                ((move_iterator<tf::Node_**> *)&stack0xffffffffffffffb0,ppNVar1);
      append<std::move_iterator<tf::Node**>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::move_backward<tf::Node**,tf::Node**>
                ((Node **)in_RDI,in_stack_ffffffffffffff78,(Node **)in_stack_ffffffffffffff70);
      std::copy<tf::Node**,tf::Node**>
                ((Node **)in_RDI,in_stack_ffffffffffffff78,(Node **)in_stack_ffffffffffffff70);
      local_8 = local_18;
    }
  }
  return local_8;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    //assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    //assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->setEnd(this->end() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }